

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

UniValue * __thiscall ExternalSigner::GetDescriptors(ExternalSigner *this,int account)

{
  long lVar1;
  int *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  ExternalSigner *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  UniValue *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator<char> *in_stack_fffffffffffffed8;
  int *__s;
  UniValue *this_00;
  allocator<char> local_10d [93];
  string *in_stack_ffffffffffffff50;
  _Alloc_hider in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff58;
  __lhs = in_RDI;
  __s = in_RSI;
  this_00 = in_RDI;
  std::operator+(in_stack_fffffffffffffed0,(char *)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 in_stack_fffffffffffffea8);
  NetworkArg_abi_cxx11_(in_stack_fffffffffffffea0);
  std::operator+(in_stack_fffffffffffffed0,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_stack_fffffffffffffea8);
  tinyformat::format<int>((char *)__rhs,in_RSI);
  std::operator+(in_stack_fffffffffffffed0,__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,in_stack_fffffffffffffed8);
  RunCommandParseJSON((string *)in_stack_ffffffffffffff58._M_p,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::allocator<char>::~allocator(local_10d);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ExternalSigner::GetDescriptors(const int account)
{
    return RunCommandParseJSON(m_command + " --fingerprint " + m_fingerprint + NetworkArg() + " getdescriptors --account " + strprintf("%d", account));
}